

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

int __thiscall
Lib::DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
::remove(DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,char *__filename)

{
  int iVar1;
  Index *pIVar2;
  Entry *pEVar3;
  IndexType *in_RDX;
  
  pEVar3 = findEntry((DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)__filename,in_RDX);
  if (pEVar3 == (Entry *)0x0) {
    this->_capacity = 0;
    this->_nextExpansionOccupancy = 0;
    this->_entries = (Entry *)0x0;
    this->_timestamp = 0;
    this->_size = 0;
    this->_deleted = 0;
    this->_capacityIndex = 0;
  }
  else {
    *(byte *)&pEVar3->field_0 = *(byte *)&pEVar3->field_0 | 1;
    *(ulong *)(__filename + 4) =
         CONCAT44((int)((ulong)*(undefined8 *)(__filename + 4) >> 0x20) + 1,
                  (int)*(undefined8 *)(__filename + 4) + -1);
    pIVar2 = (pEVar3->_val).index;
    iVar1 = (pEVar3->_val).refCnt;
    this->_deleted = pEVar3->_key;
    *(Index **)&this->_capacity = pIVar2;
    *(int *)&this->_entries = iVar1;
  }
  *(bool *)&this->_timestamp = pEVar3 != (Entry *)0x0;
  return (int)this;
}

Assistant:

Option<std::pair<Key,Val>> remove(Key const& key)
  {
    Entry* e=findEntry(key);
    if(!e) {
      return {};
    }
    e->_info.deleted=1;
    _size--;
    _deleted++;
    return some(std::pair<Key,Val>(move_if_value<Key>(e->_key), move_if_value<Val>(e->_val)));
  }